

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Annotation.cpp
# Opt level: O2

Annotation * __thiscall soul::Annotation::operator=(Annotation *this,Annotation *other)

{
  pointer __p;
  pointer local_20;
  
  if ((other->properties)._M_t.
      super___uniq_ptr_impl<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
      .
      super__Head_base<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_false>
      ._M_head_impl !=
      (vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_> *)0x0) {
    std::
    make_unique<std::vector<soul::Annotation::Property,std::allocator<soul::Annotation::Property>>,std::vector<soul::Annotation::Property,std::allocator<soul::Annotation::Property>>&>
              ((vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_> *)
               &local_20);
    __p = local_20;
    local_20 = (pointer)0x0;
    std::
    __uniq_ptr_impl<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
    ::reset((__uniq_ptr_impl<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
             *)this,(pointer)__p);
    std::
    unique_ptr<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
    ::~unique_ptr((unique_ptr<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
                   *)&local_20);
  }
  StringDictionary::operator=(&this->dictionary,&other->dictionary);
  return this;
}

Assistant:

Annotation& Annotation::operator= (const Annotation& other)
{
    if (other.properties != nullptr)
        properties = std::make_unique<std::vector<Property>> (*other.properties);

    dictionary = other.dictionary;
    return *this;
}